

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

TestInfo *
testing::internal::MakeAndRegisterTestInfo
          (char *test_suite_name,char *name,char *type_param,char *value_param,
          CodeLocation *code_location,TypeId fixture_class_id,SetUpTestSuiteFunc set_up_tc,
          TearDownTestSuiteFunc tear_down_tc,TestFactoryBase *factory)

{
  TestInfo *this;
  UnitTestImpl *this_00;
  allocator<char> local_aa;
  allocator<char> local_a9;
  char *local_a8;
  TypeId local_a0;
  string local_98;
  string local_78;
  CodeLocation local_58;
  
  local_a8 = value_param;
  local_a0 = fixture_class_id;
  this = (TestInfo *)operator_new(0x110);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,test_suite_name,&local_a9);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,name,&local_aa);
  CodeLocation::CodeLocation(&local_58,code_location);
  TestInfo::TestInfo(this,&local_78,&local_98,type_param,local_a8,&local_58,local_a0,factory);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  this_00 = GetUnitTestImpl();
  UnitTestImpl::AddTestInfo(this_00,set_up_tc,tear_down_tc,this);
  return this;
}

Assistant:

TestInfo* MakeAndRegisterTestInfo(
    const char* test_suite_name, const char* name, const char* type_param,
    const char* value_param, CodeLocation code_location,
    TypeId fixture_class_id, SetUpTestSuiteFunc set_up_tc,
    TearDownTestSuiteFunc tear_down_tc, TestFactoryBase* factory) {
  TestInfo* const test_info =
      new TestInfo(test_suite_name, name, type_param, value_param,
                   code_location, fixture_class_id, factory);
  GetUnitTestImpl()->AddTestInfo(set_up_tc, tear_down_tc, test_info);
  return test_info;
}